

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O0

void __thiscall
AI::HierarchicalTaskNetworkComponent::senseAuditory(HierarchicalTaskNetworkComponent *this)

{
  Vector2<float> position;
  Stimulus stimulus_00;
  bool bVar1;
  World *this_00;
  GameMode *this_01;
  SoundMap *this_02;
  mapped_type *pmVar2;
  float fVar3;
  key_type local_e4;
  mapped_type_conflict *local_e0;
  mapped_type_conflict *curiosity;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined1 auStack_a0 [8];
  Stimulus stimulus;
  SoundWave *wave;
  iterator __end1;
  iterator __begin1;
  vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> *__range1;
  float MINIMUM_INTENSITY_HACK;
  undefined1 local_48 [8];
  vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> sounds;
  float range;
  mapped_type location;
  SoundMap *soundMap;
  HierarchicalTaskNetworkComponent *this_local;
  
  this_00 = Component::getWorld(&this->super_Component);
  this_01 = World::getAuthGameMode(this_00);
  this_02 = GameMode::getSoundMap(this_01);
  sounds.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 5;
  pmVar2 = std::
           map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
           ::operator[](&(this->state).current.vectors,
                        (key_type *)
                        ((long)&sounds.
                                super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  position.x = pmVar2->x;
  position.y = pmVar2->y;
  sounds.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x41200000;
  SoundMap::collectSounds
            ((vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> *)local_48,this_02,position,10);
  __end1 = std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>::begin
                     ((vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> *)local_48);
  wave = (SoundWave *)
         std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>::end
                   ((vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> *)local_48);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<AI::SoundWave_*,_std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>_>
                                     *)&wave), bVar1) {
    stimulus._32_8_ =
         __gnu_cxx::
         __normal_iterator<AI::SoundWave_*,_std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>_>
         ::operator*(&__end1);
    if (10.0 < ((reference)stimulus._32_8_)->intensity ||
        ((reference)stimulus._32_8_)->intensity == 10.0) {
      stimulus.field_3._8_4_ = 0;
      stimulus.x = ((reference)stimulus._32_8_)->intensity;
      auStack_a0._0_4_ = (((reference)stimulus._32_8_)->originalPosition).x;
      auStack_a0._4_4_ = (((reference)stimulus._32_8_)->originalPosition).y;
      stimulus.intensity = (float)((reference)stimulus._32_8_)->tag;
      std::vector<AI::Stimulus,_std::allocator<AI::Stimulus>_>::push_back
                (&(this->state).memory.sensoryMemory,(value_type *)auStack_a0);
      local_b8 = CONCAT44(stimulus.field_3._12_4_,stimulus.field_3._8_4_);
      curiosity = (mapped_type_conflict *)CONCAT44(auStack_a0._4_4_,auStack_a0._0_4_);
      uStack_d0 = CONCAT44(stimulus.y,stimulus.x);
      local_c8 = CONCAT44(stimulus._12_4_,stimulus.intensity);
      uStack_c0 = stimulus.field_3._0_8_;
      stimulus_00._8_8_ = uStack_d0;
      stimulus_00._0_8_ = curiosity;
      stimulus_00.field_3._0_8_ = local_c8;
      stimulus_00.field_3.visual.target = (Actor *)stimulus.field_3._0_8_;
      stimulus_00._32_8_ = local_b8;
      encodeEngramIfUnique(stimulus_00,&(this->state).memory.shortTermMemory);
      local_e4 = Curiosity;
      local_e0 = std::
                 map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
                 ::operator[](&(this->state).current.values,&local_e4);
      fVar3 = Math::clamp(*local_e0 + stimulus.x / 10.0,0.0,100.0);
      *local_e0 = fVar3;
    }
    __gnu_cxx::
    __normal_iterator<AI::SoundWave_*,_std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>_>
    ::operator++(&__end1);
  }
  std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>::~vector
            ((vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> *)local_48);
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::senseAuditory()
{
	auto& soundMap = getWorld()->getAuthGameMode()->getSoundMap();

	auto location = state.current.vectors[WorldStateIdentifier::CurrentPosition];

	auto range = 10.f;
	auto sounds = soundMap.collectSounds({location.x, location.y}, range);
	
	const float MINIMUM_INTENSITY_HACK = 10.f;

	for (auto& wave : sounds)
	{
		if (wave.intensity < MINIMUM_INTENSITY_HACK)
			continue;

		Stimulus stimulus;
		stimulus.type = StimulusType::Auditory;
		stimulus.intensity = wave.intensity;
		stimulus.x = wave.originalPosition.x;
		stimulus.y = wave.originalPosition.y;
		stimulus.auditory.tag = wave.tag;

		state.memory.sensoryMemory.push_back(stimulus);

		encodeEngramIfUnique(stimulus, state.memory.shortTermMemory);

		//auto& alertness = state.current.values[WorldStateIdentifier::Alertness];
		//alertness = FMath::Clamp(alertness + stimulus.auditory.intensity / 100.f, 0.f, 60.f);
		auto& curiosity = state.current.values[WorldStateIdentifier::Curiosity];
		curiosity = clamp(curiosity + stimulus.intensity / 10.f, 0.f, 100.f);
	}	
}